

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

string * __thiscall
LPCMStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,LPCMStreamReader *this)

{
  ostream *poVar1;
  ostringstream str;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"Bitrate: ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Kbps  ",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"Sample Rate: ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)aoStack_1a8,this->m_freq / 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"KHz  ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"Channels: ",10);
  if (this->m_lfeExists == true) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)aoStack_1a8,this->m_channels - 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".1",2);
  }
  else {
    std::ostream::operator<<((ostream *)aoStack_1a8,(uint)this->m_channels);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_1a8,"  Bits per sample: ",0x13);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"bit",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

const std::string LPCMStreamReader::getStreamInfo()
{
    std::ostringstream str;
    const int mch = m_channels + (m_channels % 2 == 1 ? 1 : 0);
    const uint32_t bitrate = (m_bitsPerSample == 20 ? 24 : m_bitsPerSample) * m_freq * mch;
    str << "Bitrate: " << bitrate / 1000 << "Kbps  ";
    str << "Sample Rate: " << m_freq / 1000 << "KHz  ";
    str << "Channels: ";
    if (m_lfeExists)
        str << static_cast<int>(m_channels) - 1 << ".1";
    else
        str << static_cast<int>(m_channels);
    str << "  Bits per sample: " << m_bitsPerSample << "bit";
    return str.str();
}